

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::
     VectorArgMinMaxBase<duckdb::GreaterThan,false,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>
     ::Update<duckdb::ArgMinMaxState<duckdb::string_t,int>>
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  string_t new_value;
  bool bVar1;
  uint uVar2;
  string_t *psVar3;
  idx_t iVar4;
  ulong in_RCX;
  Vector *in_RDI;
  UnifiedVectorFormat *in_R8;
  ArgMinMaxState<duckdb::string_t,_int> *state_1;
  idx_t sidx_1;
  idx_t i_1;
  string_t *sort_key_data;
  Vector sliced_input;
  SelectionVector sel;
  OrderModifiers modifiers;
  Vector sort_key;
  ArgMinMaxState<duckdb::string_t,_int> *state;
  idx_t sidx;
  bool arg_null;
  idx_t aidx;
  int bval;
  idx_t bidx;
  idx_t i;
  ArgMinMaxState<duckdb::string_t,_int> **states;
  idx_t assign_count;
  sel_t assign_sel [2048];
  ArgMinMaxState<duckdb::string_t,_int> *last_state;
  UnifiedVectorFormat sdata;
  int *bys;
  bool extra_state;
  UnifiedVectorFormat bdata;
  Vector *by;
  UnifiedVectorFormat adata;
  Vector *arg;
  UnifiedVectorFormat *in_stack_ffffffffffffdd18;
  SelectionVector *in_stack_ffffffffffffdd20;
  undefined6 in_stack_ffffffffffffdd28;
  undefined1 in_stack_ffffffffffffdd2e;
  undefined1 in_stack_ffffffffffffdd2f;
  UnifiedVectorFormat *this;
  sel_t *in_stack_ffffffffffffdd38;
  SelectionVector *in_stack_ffffffffffffdd40;
  idx_t local_22a8;
  Vector local_2290 [104];
  SelectionVector local_2228;
  OrderModifiers local_220a;
  LogicalType local_2208 [24];
  Vector local_21f0 [108];
  undefined4 local_2184;
  ArgMinMaxState<duckdb::string_t,_int> *local_2180;
  idx_t local_2178;
  byte local_2169;
  idx_t local_2168;
  int local_215c;
  idx_t local_2158;
  UnifiedVectorFormat *local_2150;
  ArgMinMaxState<duckdb::string_t,_int> **local_2148;
  ulong local_2140;
  uint local_2138 [2048];
  ArgMinMaxState<duckdb::string_t,_int> *local_138;
  SelectionVector *local_130 [9];
  int *local_e8;
  undefined1 local_d9;
  SelectionVector *local_d8 [9];
  Vector *local_90;
  SelectionVector *local_78 [9];
  Vector *local_30;
  UnifiedVectorFormat *local_28;
  ulong local_20;
  Vector *local_8;
  
  this = (UnifiedVectorFormat *)local_78;
  local_30 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this);
  duckdb::Vector::ToUnifiedFormat((ulong)local_30,local_28);
  local_90 = local_8 + 0x68;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_d8);
  local_d9 = SpecializedGenericArgMinMaxState::CreateExtraState((idx_t)local_28);
  SpecializedGenericArgMinMaxState::PrepareData
            ((Vector *)this,
             CONCAT17(in_stack_ffffffffffffdd2f,
                      CONCAT16(in_stack_ffffffffffffdd2e,in_stack_ffffffffffffdd28)),
             (bool *)in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd18);
  local_e8 = UnifiedVectorFormat::GetData<int>((UnifiedVectorFormat *)local_d8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_130);
  duckdb::Vector::ToUnifiedFormat(local_20,local_28);
  local_138 = (ArgMinMaxState<duckdb::string_t,_int> *)0x0;
  local_2140 = 0;
  local_2148 = UnifiedVectorFormat::GetData<duckdb::ArgMinMaxState<duckdb::string_t,int>*>
                         ((UnifiedVectorFormat *)local_130);
  for (local_2150 = (UnifiedVectorFormat *)0x0; local_2150 < local_28; local_2150 = local_2150 + 1)
  {
    local_2158 = SelectionVector::get_index(local_d8[0],(idx_t)local_2150);
    in_stack_ffffffffffffdd2f =
         TemplatedValidityMask<unsigned_long>::RowIsValid
                   ((TemplatedValidityMask<unsigned_long> *)
                    CONCAT17(in_stack_ffffffffffffdd2f,
                             CONCAT16(in_stack_ffffffffffffdd2e,in_stack_ffffffffffffdd28)),
                    (idx_t)in_stack_ffffffffffffdd20);
    if ((bool)in_stack_ffffffffffffdd2f) {
      local_215c = local_e8[local_2158];
      local_2168 = SelectionVector::get_index(local_78[0],(idx_t)local_2150);
      in_stack_ffffffffffffdd2e =
           TemplatedValidityMask<unsigned_long>::RowIsValid
                     ((TemplatedValidityMask<unsigned_long> *)
                      CONCAT17(in_stack_ffffffffffffdd2f,
                               CONCAT16(in_stack_ffffffffffffdd2e,in_stack_ffffffffffffdd28)),
                      (idx_t)in_stack_ffffffffffffdd20);
      local_2169 = (in_stack_ffffffffffffdd2e ^ 0xff) & 1;
      local_2178 = SelectionVector::get_index(local_130[0],(idx_t)local_2150);
      local_2180 = local_2148[local_2178];
      if ((((local_2180->super_ArgMinMaxStateBase).is_initialized & 1U) == 0) ||
         (bVar1 = GreaterThan::Operation<int>(&local_215c,&local_2180->value), bVar1)) {
        ArgMinMaxStateBase::AssignValue<int>(&local_2180->value,local_215c);
        (local_2180->super_ArgMinMaxStateBase).arg_null = (bool)(local_2169 & 1);
        if ((local_2169 & 1) == 0) {
          if (local_2180 == local_138) {
            local_2140 = local_2140 - 1;
          }
          uVar2 = UnsafeNumericCast<unsigned_int,unsigned_long,void>((unsigned_long)local_2150);
          local_2138[local_2140] = uVar2;
          local_138 = local_2180;
          local_2140 = local_2140 + 1;
        }
        (local_2180->super_ArgMinMaxStateBase).is_initialized = true;
      }
    }
  }
  if (local_2140 == 0) {
    local_2184 = 1;
  }
  else {
    duckdb::LogicalType::LogicalType(local_2208,BLOB);
    duckdb::Vector::Vector(local_21f0,local_2208,0x800);
    duckdb::LogicalType::~LogicalType(local_2208);
    OrderModifiers::OrderModifiers(&local_220a,DESCENDING,NULLS_LAST);
    SelectionVector::SelectionVector(in_stack_ffffffffffffdd40,in_stack_ffffffffffffdd38);
    duckdb::Vector::Vector(local_2290,local_30,&local_2228,local_2140);
    duckdb::CreateSortKeyHelpers::CreateSortKey(local_2290,local_2140,local_220a,local_21f0);
    psVar3 = FlatVector::GetData<duckdb::string_t>((Vector *)0x96861c);
    for (local_22a8 = 0; local_22a8 < local_2140; local_22a8 = local_22a8 + 1) {
      in_stack_ffffffffffffdd20 = local_130[0];
      iVar4 = SelectionVector::get_index(&local_2228,local_22a8);
      iVar4 = SelectionVector::get_index(in_stack_ffffffffffffdd20,iVar4);
      new_value.value.pointer.ptr = (char *)iVar4;
      new_value.value._0_8_ = local_2148[iVar4];
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((string_t *)psVar3[local_22a8].value.pointer.ptr,new_value);
    }
    Vector::~Vector((Vector *)in_stack_ffffffffffffdd20);
    SelectionVector::~SelectionVector((SelectionVector *)0x968756);
    Vector::~Vector((Vector *)in_stack_ffffffffffffdd20);
    local_2184 = 0;
  }
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_ffffffffffffdd20);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_ffffffffffffdd20);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_ffffffffffffdd20);
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &, idx_t input_count, Vector &state_vector, idx_t count) {
		auto &arg = inputs[0];
		UnifiedVectorFormat adata;
		arg.ToUnifiedFormat(count, adata);

		using ARG_TYPE = typename STATE::ARG_TYPE;
		using BY_TYPE = typename STATE::BY_TYPE;
		auto &by = inputs[1];
		UnifiedVectorFormat bdata;
		auto extra_state = UPDATE_TYPE::CreateExtraState(count);
		UPDATE_TYPE::PrepareData(by, count, extra_state, bdata);
		const auto bys = UnifiedVectorFormat::GetData<BY_TYPE>(bdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		STATE *last_state = nullptr;
		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto bidx = bdata.sel->get_index(i);
			if (!bdata.validity.RowIsValid(bidx)) {
				continue;
			}
			const auto bval = bys[bidx];

			const auto aidx = adata.sel->get_index(i);
			const auto arg_null = !adata.validity.RowIsValid(aidx);
			if (IGNORE_NULL && arg_null) {
				continue;
			}

			const auto sidx = sdata.sel->get_index(i);
			auto &state = *states[sidx];
			if (!state.is_initialized || COMPARATOR::template Operation<BY_TYPE>(bval, state.value)) {
				STATE::template AssignValue<BY_TYPE>(state.value, bval);
				state.arg_null = arg_null;
				// micro-adaptivity: it is common we overwrite the same state repeatedly
				// e.g. when running arg_max(val, ts) and ts is sorted in ascending order
				// this check essentially says:
				// "if we are overriding the same state as the last row, the last write was pointless"
				// hence we skip the last write altogether
				if (!arg_null) {
					if (&state == last_state) {
						assign_count--;
					}
					assign_sel[assign_count++] = UnsafeNumericCast<sel_t>(i);
					last_state = &state;
				}
				state.is_initialized = true;
			}
		}
		if (assign_count == 0) {
			// no need to assign anything: nothing left to do
			return;
		}
		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		SelectionVector sel(assign_sel);
		Vector sliced_input(arg, sel, assign_count);
		CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto sidx = sdata.sel->get_index(sel.get_index(i));
			auto &state = *states[sidx];
			STATE::template AssignValue<ARG_TYPE>(state.arg, sort_key_data[i]);
		}
	}